

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl
          (cmELFInternalImpl<cmELFTypes64> *this,cmELF *external,
          unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  bool bVar1;
  ostream *poVar2;
  ELF_Half i;
  ushort uVar3;
  char *msg;
  FileType FVar4;
  char *local_1b8 [4];
  ostringstream e;
  
  cmELFInternal::cmELFInternal(&this->super_cmELFInternal,external,fin,order);
  (this->super_cmELFInternal)._vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternalImpl_005e2228;
  (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Read(this,&this->ELFHeader);
  if (bVar1) {
    uVar3 = (this->ELFHeader).e_type;
    FVar4 = (FileType)uVar3;
    switch(uVar3) {
    case 0:
      msg = "ELF file type is NONE.";
      goto LAB_0027bba1;
    case 1:
      break;
    case 2:
      FVar4 = FileTypeExecutable;
      break;
    case 3:
      FVar4 = FileTypeSharedLibrary;
      break;
    case 4:
      FVar4 = FileTypeCore;
      break;
    default:
      if ((uVar3 & 0xff00) == 0xfe00) {
        FVar4 = FileTypeSpecificOS;
      }
      else {
        if (uVar3 < 0xff00) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar2 = std::operator<<((ostream *)&e,"Unknown ELF file type ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__cxx11::stringbuf::str();
          cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,local_1b8[0]);
          std::__cxx11::string::~string((string *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return;
        }
        FVar4 = FileTypeSpecificProc;
      }
    }
    (this->super_cmELFInternal).ELFType = FVar4;
    std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::resize
              (&this->SectionHeaders,(ulong)(this->ELFHeader).e_shnum);
    uVar3 = 0;
    do {
      if ((this->ELFHeader).e_shnum <= uVar3) {
        return;
      }
      bVar1 = LoadSectionHeader(this,uVar3);
      uVar3 = uVar3 + 1;
    } while (bVar1);
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to load section headers.");
  }
  else {
    msg = "Failed to read main ELF header.";
LAB_0027bba1:
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
  }
  return;
}

Assistant:

cmELFInternalImpl<Types>::cmELFInternalImpl(
  cmELF* external, std::unique_ptr<cmsys::ifstream>& fin, ByteOrderType order)
  : cmELFInternal(external, fin, order)
{
  // Read the main header.
  if (!this->Read(this->ELFHeader)) {
    this->SetErrorMessage("Failed to read main ELF header.");
    return;
  }

  // Determine the ELF file type.
  switch (this->ELFHeader.e_type) {
    case ET_NONE:
      this->SetErrorMessage("ELF file type is NONE.");
      return;
    case ET_REL:
      this->ELFType = cmELF::FileTypeRelocatableObject;
      break;
    case ET_EXEC:
      this->ELFType = cmELF::FileTypeExecutable;
      break;
    case ET_DYN:
      this->ELFType = cmELF::FileTypeSharedLibrary;
      break;
    case ET_CORE:
      this->ELFType = cmELF::FileTypeCore;
      break;
    default: {
      unsigned int eti = static_cast<unsigned int>(this->ELFHeader.e_type);
#if defined(ET_LOOS) && defined(ET_HIOS)
      if (eti >= ET_LOOS && eti <= ET_HIOS) {
        this->ELFType = cmELF::FileTypeSpecificOS;
        break;
      }
#endif
#if defined(ET_LOPROC) && defined(ET_HIPROC)
      if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
        this->ELFType = cmELF::FileTypeSpecificProc;
        break;
      }
#endif
      std::ostringstream e;
      e << "Unknown ELF file type " << eti;
      this->SetErrorMessage(e.str().c_str());
      return;
    }
  }

  // Load the section headers.
  this->SectionHeaders.resize(this->ELFHeader.e_shnum);
  for (ELF_Half i = 0; i < this->ELFHeader.e_shnum; ++i) {
    if (!this->LoadSectionHeader(i)) {
      this->SetErrorMessage("Failed to load section headers.");
      return;
    }
  }
}